

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::JobManager::MakeBorderRouterChoice
          (Error *__return_storage_ptr__,JobManager *this,uint64_t aNid,BorderRouter *br)

{
  pointer *ppBVar1;
  bool bVar2;
  element_type *peVar3;
  size_type sVar4;
  reference pvVar5;
  reference pBVar6;
  v10 *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar7;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  anon_class_1_0_00000001 local_4da;
  v10 local_4d9;
  v10 *local_4d8;
  size_t local_4d0;
  string local_4c8;
  Error local_4a8;
  reference local_480;
  BorderRouter *item_5;
  iterator __end2_2;
  iterator __begin2_2;
  BRArray *__range2_2;
  BorderRouter *item_4;
  iterator __end2_1;
  iterator __begin2_1;
  BRArray *__range2_1;
  BorderRouter *item_3;
  iterator __end2;
  iterator __begin2;
  BRArray *__range2;
  BorderRouter *item_2;
  iterator __end3_2;
  iterator __begin3_2;
  BRArray *__range3_2;
  BorderRouter *item_1;
  iterator __end3_1;
  iterator __begin3_1;
  BRArray *__range3_1;
  BorderRouter *item;
  iterator __end3;
  iterator __begin3;
  BRArray *__range3;
  anon_class_1_0_00000001 local_39a;
  v10 local_399;
  v10 *local_398;
  char *local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  Error local_368;
  undefined1 local_340 [7];
  v10 local_339;
  undefined8 local_338;
  char *local_330;
  string local_328;
  Error local_308;
  Status local_2dd;
  RegistryStatus status;
  undefined1 local_2d0 [8];
  Network nwk;
  BRArray choice;
  BRArray brs;
  BorderRouter *br_local;
  uint64_t aNid_local;
  JobManager *this_local;
  Error *error;
  undefined1 local_200 [16];
  v10 *local_1f0;
  ulong local_1e8;
  v10 *local_1e0;
  size_t sStack_1d8;
  string *local_1d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_1c8 [2];
  undefined1 local_1b8 [16];
  v10 *local_1a8;
  char *local_1a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_198;
  v10 *local_190;
  char *pcStack_188;
  string *local_180;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_178 [3];
  undefined1 local_160 [16];
  v10 *local_150;
  char *local_148;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_140;
  v10 *local_138;
  char *pcStack_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  v10 *local_120;
  undefined8 *local_118;
  v10 *local_110;
  v10 **local_108;
  v10 *local_100;
  v10 **local_f8;
  v10 **local_f0;
  v10 *local_e8;
  size_t sStack_e0;
  Error **local_d0;
  undefined1 *local_c8;
  Error **local_c0;
  Error **local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_a0;
  undefined1 *local_98;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_90;
  undefined8 local_88;
  undefined1 *local_80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_78;
  v10 **local_70;
  v10 *local_68;
  char *pcStack_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_50;
  undefined1 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_40;
  undefined8 local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_28;
  v10 **local_20;
  v10 *local_18;
  char *pcStack_10;
  
  Error::Error(__return_storage_ptr__);
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::vector((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            *)&choice.
               super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::vector((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            *)&nwk.mCcm);
  persistent_storage::Network::Network((Network *)local_2d0);
  peVar3 = std::
           __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mInterpreter->mRegistry);
  this_00 = (v10 *)aNid;
  local_2dd = persistent_storage::Registry::GetBorderRoutersInNetwork
                        (peVar3,aNid,
                         (BorderRouterArray *)
                         &choice.
                          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_2dd == kSuccess) {
    sVar4 = std::
            vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ::size((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                    *)&choice.
                       super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar4 == 1) {
      pvVar5 = std::
               vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
               ::front((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                        *)&choice.
                           super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      persistent_storage::BorderRouter::operator=(br,pvVar5);
    }
    else {
      peVar3 = std::
               __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mInterpreter->mRegistry);
      local_2dd = persistent_storage::Registry::GetNetworkByXpan(peVar3,aNid,(Network *)local_2d0);
      if (local_2dd == kSuccess) {
        if ((int)nwk.mMlp.field_2._8_4_ < 1) {
          ppBVar1 = &choice.
                     super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          __end3_2 = std::
                     vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                     ::begin((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                              *)ppBVar1);
          item_2 = (BorderRouter *)
                   std::
                   vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                   ::end((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                          *)ppBVar1);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3_2,
                                    (__normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                                     *)&item_2), bVar2) {
            pBVar6 = __gnu_cxx::
                     __normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                     ::operator*(&__end3_2);
            if (((uint)(pBVar6->mAgent).mState & 7) != 0) {
              std::
              vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ::push_back((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                           *)&nwk.mCcm,pBVar6);
            }
            __gnu_cxx::
            __normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
            ::operator++(&__end3_2);
          }
        }
        else {
          ppBVar1 = &choice.
                     super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          __end3 = std::
                   vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                   ::begin((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                            *)ppBVar1);
          item = (BorderRouter *)
                 std::
                 vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                 ::end((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                        *)ppBVar1);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                                             *)&item), bVar2) {
            pBVar6 = __gnu_cxx::
                     __normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                     ::operator*(&__end3);
            if (((((*(ushort *)&(pBVar6->mAgent).mState >> 8 & 1) != 0) &&
                 (((uint)(pBVar6->mAgent).mState & 7) != 0)) &&
                ((*(ushort *)&(pBVar6->mAgent).mState >> 7 & 1) != 0)) &&
               ((*(ushort *)&(pBVar6->mAgent).mState >> 3 & 3) != 0)) {
              persistent_storage::BorderRouter::operator=(br,pBVar6);
              goto LAB_001bcc98;
            }
            __gnu_cxx::
            __normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
            ::operator++(&__end3);
          }
          ppBVar1 = &choice.
                     super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          __end3_1 = std::
                     vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                     ::begin((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                              *)ppBVar1);
          item_1 = (BorderRouter *)
                   std::
                   vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                   ::end((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                          *)ppBVar1);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3_1,
                                    (__normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                                     *)&item_1), bVar2) {
            pBVar6 = __gnu_cxx::
                     __normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                     ::operator*(&__end3_1);
            if (((*(ushort *)&(pBVar6->mAgent).mState >> 7 & 1) != 0) &&
               (((uint)(pBVar6->mAgent).mState & 7) != 0)) {
              std::
              vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ::push_back((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                           *)&nwk.mCcm,pBVar6);
            }
            __gnu_cxx::
            __normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
            ::operator++(&__end3_1);
          }
        }
        __end2 = std::
                 vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                 ::begin((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                          *)&nwk.mCcm);
        item_3 = (BorderRouter *)
                 std::
                 vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                 ::end((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                        *)&nwk.mCcm);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                                           *)&item_3), bVar2) {
          pBVar6 = __gnu_cxx::
                   __normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                   ::operator*(&__end2);
          if ((1 < (*(ushort *)&(pBVar6->mAgent).mState >> 3 & 3)) &&
             ((*(ushort *)&(pBVar6->mAgent).mState >> 5 & 3) != 0)) {
            persistent_storage::BorderRouter::operator=(br,pBVar6);
            goto LAB_001bcc98;
          }
          __gnu_cxx::
          __normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
          ::operator++(&__end2);
        }
        __end2_1 = std::
                   vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                   ::begin((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                            *)&nwk.mCcm);
        item_4 = (BorderRouter *)
                 std::
                 vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                 ::end((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                        *)&nwk.mCcm);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_1,
                                  (__normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                                   *)&item_4), bVar2) {
          pBVar6 = __gnu_cxx::
                   __normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                   ::operator*(&__end2_1);
          if (1 < (*(ushort *)&(pBVar6->mAgent).mState >> 3 & 3)) {
            persistent_storage::BorderRouter::operator=(br,pBVar6);
            goto LAB_001bcc98;
          }
          __gnu_cxx::
          __normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
          ::operator++(&__end2_1);
        }
        __end2_2 = std::
                   vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                   ::begin((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                            *)&nwk.mCcm);
        item_5 = (BorderRouter *)
                 std::
                 vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                 ::end((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                        *)&nwk.mCcm);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_2,
                                  (__normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                                   *)&item_5), bVar2) {
          local_480 = __gnu_cxx::
                      __normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                      ::operator*(&__end2_2);
          if ((*(ushort *)&(local_480->mAgent).mState >> 3 & 3) != 0) {
            persistent_storage::BorderRouter::operator=(br,local_480);
            goto LAB_001bcc98;
          }
          __gnu_cxx::
          __normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
          ::operator++(&__end2_2);
        }
        MakeBorderRouterChoice::anon_class_1_0_00000001::operator()(&local_4da);
        local_f8 = &local_4d8;
        local_100 = &local_4d9;
        bVar7 = ::fmt::v10::operator()(local_100);
        local_4d0 = bVar7.size_;
        local_4d8 = (v10 *)bVar7.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_1d0 = &local_4c8;
        local_1e0 = local_4d8;
        sStack_1d8 = local_4d0;
        local_f0 = &local_1e0;
        local_1f0 = local_4d8;
        local_1e8 = local_4d0;
        local_e8 = local_1f0;
        sStack_e0 = local_1e8;
        error = (Error *)::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
        ;
        local_c8 = local_200;
        local_d0 = &error;
        local_b0 = 0;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)local_d0;
        fmt_01.size_ = 0;
        fmt_01.data_ = (char *)local_1e8;
        local_c0 = local_d0;
        local_b8 = local_d0;
        local_a8 = local_c8;
        ::fmt::v10::vformat_abi_cxx11_(&local_4c8,local_1f0,fmt_01,args_01);
        Error::Error(&local_4a8,kNotFound,&local_4c8);
        Error::operator=(__return_storage_ptr__,&local_4a8);
        Error::~Error(&local_4a8);
        std::__cxx11::string::~string((string *)&local_4c8);
      }
      else {
        MakeBorderRouterChoice::anon_class_1_0_00000001::operator()(&local_39a);
        local_108 = &local_398;
        local_110 = &local_399;
        bVar7 = ::fmt::v10::operator()(local_110);
        local_390 = (char *)bVar7.size_;
        local_398 = (v10 *)bVar7.data_;
        ::fmt::v10::detail::
        check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                  ();
        utils::Hex<unsigned_long>((string *)&__range3,aNid);
        local_128 = &local_388;
        local_138 = local_398;
        pcStack_130 = local_390;
        local_140 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&__range3;
        local_20 = &local_138;
        local_150 = local_398;
        local_148 = local_390;
        local_18 = local_150;
        pcStack_10 = local_148;
        local_178[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                 (local_140,(v10 *)aNid,local_128);
        local_98 = local_160;
        local_a0 = local_178;
        local_88 = 0xd;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_a0;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = local_148;
        local_90 = local_a0;
        local_80 = local_98;
        local_78 = local_a0;
        ::fmt::v10::vformat_abi_cxx11_(&local_388,local_150,fmt_00,args_00);
        Error::Error(&local_368,kNotFound,&local_388);
        Error::operator=(__return_storage_ptr__,&local_368);
        Error::~Error(&local_368);
        std::__cxx11::string::~string((string *)&local_388);
        std::__cxx11::string::~string((string *)&__range3);
      }
    }
  }
  else {
    MakeBorderRouterChoice::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)(local_340 + 6));
    local_118 = &local_338;
    local_120 = &local_339;
    bVar7 = ::fmt::v10::operator()(local_120);
    local_330 = (char *)bVar7.size_;
    local_338 = bVar7.data_;
    ::fmt::v10::detail::check_format_string<int,_FMT_COMPILE_STRING,_0>();
    local_340._0_4_ = ZEXT14(local_2dd);
    local_180 = &local_328;
    local_190 = (v10 *)local_338;
    pcStack_188 = local_330;
    local_198 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *)
                local_340;
    local_70 = &local_190;
    local_1a8 = (v10 *)local_338;
    local_1a0 = local_330;
    local_68 = local_1a8;
    pcStack_60 = local_1a0;
    local_1c8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,int>
                             (local_198,this_00,(int *)local_180);
    local_48 = local_1b8;
    local_50 = local_1c8;
    local_38 = 1;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_50;
    fmt.size_ = 1;
    fmt.data_ = local_1a0;
    local_40 = local_50;
    local_30 = local_48;
    local_28 = local_50;
    ::fmt::v10::vformat_abi_cxx11_(&local_328,local_1a8,fmt,args);
    Error::Error(&local_308,kRegistryError,&local_328);
    Error::operator=(__return_storage_ptr__,&local_308);
    Error::~Error(&local_308);
    std::__cxx11::string::~string((string *)&local_328);
  }
LAB_001bcc98:
  persistent_storage::Network::~Network((Network *)local_2d0);
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::~vector((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
             *)&nwk.mCcm);
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::~vector((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
             *)&choice.
                super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::MakeBorderRouterChoice(uint64_t aNid, BorderRouter &br)
{
    Error          error;
    BRArray        brs;
    BRArray        choice;
    Network        nwk;
    RegistryStatus status = mInterpreter.mRegistry->GetBorderRoutersInNetwork(aNid, brs);

    VerifyOrExit(status == RegistryStatus::kSuccess,
                 error = ERROR_REGISTRY_ERROR("br lookup failed with status={}", static_cast<int>(status)));
    if (brs.size() == 1)
    {
        // looks like not much of a choice
        br = brs.front();
        ExitNow();
    }
    status = mInterpreter.mRegistry->GetNetworkByXpan(aNid, nwk);
    VerifyOrExit(status == RegistryStatus::kSuccess,
                 error = ERROR_NOT_FOUND("network not found by XPAN '{}'", utils::Hex(aNid)));
    if (nwk.mCcm > 0) // Dealing with domain network
    {
        // - try to find active and connectable Primary BBR
        for (const auto &item : brs)
        {
            if (item.mAgent.mState.mBbrIsPrimary &&
                item.mAgent.mState.mConnectionMode > BorderAgent::State::ConnectionMode::kNotAllowed)
            {
                if (item.mAgent.mState.mBbrIsActive &&
                    item.mAgent.mState.mThreadIfStatus > BorderAgent::State::ThreadInterfaceStatus::kNotInitialized)
                {
                    /// @todo: ideally here we would make sure the
                    ///        Border Router's connection mode @ref
                    ///        BorderAgent::State::ConnectionMode::kX509Connection
                    ///        is specified, otherwise the announced
                    ///        BBR appears inconsistent with Thread
                    ///        spec. Although nothing we could do at
                    ///        runtime here, a warning message might
                    ///        be useful as an indication of a
                    ///        potential issue
                    br = item;
                    ExitNow();
                }
            }
        }
        // - go on with other active and connectable BBRs
        for (const auto &item : brs)
        {
            if (item.mAgent.mState.mBbrIsActive &&
                item.mAgent.mState.mConnectionMode > BorderAgent::State::ConnectionMode::kNotAllowed)
            {
                choice.push_back(item);
            }
        }
    }
    else // Dealing with standalone networks
    {
        // go on with connectable BRs
        for (const auto &item : brs)
        {
            if (item.mAgent.mState.mConnectionMode > BorderAgent::State::ConnectionMode::kNotAllowed)
            {
                choice.push_back(item);
            }
        }
    }

    // Below a final triage is done

    // - prefer br with high-availability
    for (const auto &item : choice)
    {
        if (item.mAgent.mState.mThreadIfStatus > BorderAgent::State::ThreadInterfaceStatus::kNotActive &&
            item.mAgent.mState.mAvailability > BorderAgent::State::Availability::kInfrequent)
        {
            br = item;
            ExitNow();
        }
    }
    // - prefer br with Thread Interface actively participating in communication
    for (const auto &item : choice)
    {
        if (item.mAgent.mState.mThreadIfStatus > BorderAgent::State::ThreadInterfaceStatus::kNotActive)
        {
            br = item;
            ExitNow();
        }
    }
    // - try to find br with Thread Interface at least enabled
    for (const auto &item : choice)
    {
        if (item.mAgent.mState.mThreadIfStatus > BorderAgent::State::ThreadInterfaceStatus::kNotInitialized)
        {
            br = item;
            ExitNow();
        }
    }
    error = ERROR_NOT_FOUND("no active BR found");
exit:
    return error;
}